

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

Object * __thiscall
nvim::Nvim::get_proc_abi_cxx11_(Object *__return_storage_ptr__,Nvim *this,Integer pid)

{
  allocator local_39;
  Integer local_38;
  string local_30;
  
  (__return_storage_ptr__->super_variant<_cf2d41c5_>).which_ = 0;
  local_38 = pid;
  std::__cxx11::string::string((string *)&local_30,"nvim_get_proc",&local_39);
  NvimRPC::call<long>(&this->client_,&local_30,__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Object Nvim::get_proc(Integer pid) {
    Object res;
    client_.call("nvim_get_proc", res, pid);
    return res;
}